

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawSpanMaskedAddClampPalCommand::Execute
          (DrawSpanMaskedAddClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  dsfixed_t dVar3;
  dsfixed_t dVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  dsfixed_t dVar18;
  dsfixed_t dVar19;
  int iVar20;
  
  iVar1 = (this->super_PalSpanCommand)._y;
  if (((thread->pass_start_y <= iVar1) && (iVar1 < thread->pass_end_y)) &&
     (iVar1 % thread->num_cores == thread->core)) {
    puVar5 = (this->super_PalSpanCommand)._source;
    puVar6 = (this->super_PalSpanCommand)._colormap;
    puVar7 = (this->super_PalSpanCommand)._srcblend;
    puVar8 = (this->super_PalSpanCommand)._destblend;
    dVar18 = (this->super_PalSpanCommand)._xfrac;
    dVar19 = (this->super_PalSpanCommand)._yfrac;
    iVar2 = (this->super_PalSpanCommand)._x1;
    iVar13 = (&ylookup)[iVar1] + iVar2;
    iVar20 = ((this->super_PalSpanCommand)._x2 - iVar2) + 1;
    dVar3 = (this->super_PalSpanCommand)._xstep;
    dVar4 = (this->super_PalSpanCommand)._ystep;
    iVar1 = (this->super_PalSpanCommand)._xbits;
    iVar2 = (this->super_PalSpanCommand)._ybits;
    puVar9 = (this->super_PalSpanCommand)._destorg;
    if (iVar2 == 6 && iVar1 == 6) {
      lVar14 = 0;
      do {
        uVar15 = (ulong)puVar5[dVar19 >> 0x1a | dVar18 >> 0x14 & 0xffffffc0];
        if (uVar15 != 0) {
          uVar17 = puVar8[puVar9[lVar14 + iVar13]] + puVar7[puVar6[uVar15]];
          uVar16 = uVar17 & 0x40100400;
          uVar16 = uVar16 - (uVar16 >> 5) | uVar17 & 0x3e0f83e0 | 0x1f07c1f;
          puVar9[lVar14 + iVar13] = RGB32k.All[uVar16 >> 0xf & uVar16];
        }
        dVar18 = dVar18 + dVar3;
        dVar19 = dVar19 + dVar4;
        lVar14 = lVar14 + 1;
      } while (iVar20 != (int)lVar14);
    }
    else {
      bVar12 = (byte)iVar2;
      bVar11 = 0x20 - bVar12;
      bVar10 = (byte)iVar1;
      lVar14 = 0;
      do {
        uVar15 = (ulong)puVar5[(int)((dVar19 >> (bVar11 & 0x1f)) +
                                    (dVar18 >> (bVar11 - bVar10 & 0x1f) &
                                    ~(-1 << (bVar10 & 0x1f)) << (bVar12 & 0x1f)))];
        if (uVar15 != 0) {
          uVar17 = puVar8[puVar9[lVar14 + iVar13]] + puVar7[puVar6[uVar15]];
          uVar16 = uVar17 & 0x40100400;
          uVar16 = uVar16 - (uVar16 >> 5) | uVar17 & 0x3e0f83e0 | 0x1f07c1f;
          puVar9[lVar14 + iVar13] = RGB32k.All[uVar16 >> 0xf & uVar16];
        }
        dVar18 = dVar18 + dVar3;
        dVar19 = dVar19 + dVar4;
        lVar14 = lVar14 + 1;
      } while (iVar20 != (int)lVar14);
    }
  }
  return;
}

Assistant:

void DrawSpanMaskedAddClampPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}